

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_GetChainTypeString::test_method(util_GetChainTypeString *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar4;
  char *in_stack_ffffffffffffe188;
  lazy_ostream *in_stack_ffffffffffffe190;
  char *in_stack_ffffffffffffe198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe1a0;
  undefined6 in_stack_ffffffffffffe1a8;
  undefined1 in_stack_ffffffffffffe1ae;
  undefined1 in_stack_ffffffffffffe1af;
  const_string *in_stack_ffffffffffffe1b0;
  ArgsManager *in_stack_ffffffffffffe1b8;
  undefined7 in_stack_ffffffffffffe1c0;
  undefined1 in_stack_ffffffffffffe1c7;
  lazy_ostream *in_stack_ffffffffffffe1c8;
  iterator in_stack_ffffffffffffe1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe1d8;
  string *in_stack_ffffffffffffe240;
  undefined7 in_stack_ffffffffffffe248;
  undefined1 in_stack_ffffffffffffe24f;
  undefined8 in_stack_ffffffffffffe250;
  undefined8 uVar5;
  undefined6 in_stack_ffffffffffffe258;
  undefined1 in_stack_ffffffffffffe25e;
  undefined1 in_stack_ffffffffffffe25f;
  path *local_1920;
  runtime_error *ex_4;
  runtime_error *ex_3;
  runtime_error *ex_2;
  runtime_error *ex_1;
  runtime_error *ex;
  char *testnetconf;
  util_GetChainTypeString *this_local;
  const_string local_17c8;
  lazy_ostream local_17b8 [2];
  assertion_result local_1798 [3];
  allocator<char> local_1739;
  const_string local_1738 [2];
  lazy_ostream local_1718 [2];
  assertion_result local_16f8 [2];
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [71];
  allocator<char> local_1669;
  const_string local_1668 [2];
  lazy_ostream local_1648 [2];
  assertion_result local_1628 [6];
  const_string local_1588;
  lazy_ostream local_1578 [2];
  assertion_result local_1558 [3];
  allocator<char> local_14f9;
  const_string local_14f8 [2];
  lazy_ostream local_14d8 [2];
  assertion_result local_14b8 [2];
  undefined1 local_1480 [16];
  undefined1 local_1470 [71];
  allocator<char> local_1429;
  const_string local_1428 [2];
  lazy_ostream local_1408 [2];
  assertion_result local_13e8 [2];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [71];
  allocator<char> local_1359;
  const_string local_1358 [2];
  lazy_ostream local_1338 [2];
  assertion_result local_1318 [2];
  allocator<char> local_12d9 [105];
  const_string local_1270;
  lazy_ostream local_1260 [2];
  assertion_result local_1240 [3];
  allocator<char> local_11e1;
  const_string local_11e0 [2];
  lazy_ostream local_11c0 [2];
  assertion_result local_11a0 [2];
  undefined1 local_1168 [16];
  undefined1 local_1158 [71];
  allocator<char> local_1111;
  const_string local_1110 [2];
  lazy_ostream local_10f0 [2];
  assertion_result local_10d0 [6];
  const_string local_1030;
  lazy_ostream local_1020 [2];
  assertion_result local_1000 [3];
  allocator<char> local_fa1;
  const_string local_fa0 [2];
  lazy_ostream local_f80 [2];
  assertion_result local_f60 [2];
  undefined1 local_f28 [16];
  undefined1 local_f18 [71];
  allocator<char> local_ed1;
  const_string local_ed0 [2];
  lazy_ostream local_eb0 [2];
  assertion_result local_e90 [2];
  undefined1 local_e58 [16];
  undefined1 local_e48 [71];
  allocator<char> local_e01;
  const_string local_e00 [2];
  lazy_ostream local_de0 [2];
  assertion_result local_dc0 [6];
  const_string local_d20;
  lazy_ostream local_d10 [2];
  assertion_result local_cf0 [3];
  const_string local_c98 [2];
  lazy_ostream local_c78 [2];
  assertion_result local_c58 [2];
  undefined1 local_c20 [16];
  undefined1 local_c10 [64];
  const_string local_bd0 [2];
  lazy_ostream local_bb0 [2];
  assertion_result local_b90 [2];
  undefined1 local_b58 [16];
  undefined1 local_b48 [64];
  const_string local_b08 [2];
  lazy_ostream local_ae8 [2];
  assertion_result local_ac8 [2];
  undefined1 local_a90 [16];
  undefined1 local_a80 [64];
  const_string local_a40 [2];
  lazy_ostream local_a20 [2];
  assertion_result local_a00 [2];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [64];
  const_string local_978 [2];
  lazy_ostream local_958 [2];
  assertion_result local_938 [2];
  undefined1 local_900 [16];
  undefined1 local_8f0 [64];
  const_string local_8b0 [2];
  lazy_ostream local_890 [2];
  assertion_result local_870 [2];
  undefined1 local_838 [16];
  undefined1 local_828 [64];
  const_string local_7e8 [2];
  lazy_ostream local_7c8 [2];
  assertion_result local_7a8 [3];
  char *local_750;
  Flags local_748;
  undefined4 local_73c;
  char *local_738;
  Flags local_730;
  undefined4 local_724;
  char *local_720;
  Flags local_718;
  undefined4 local_70c;
  pair<const_char_*,_ArgsManager::Flags> regtest;
  pair<const_char_*,_ArgsManager::Flags> testnet4;
  pair<const_char_*,_ArgsManager::Flags> testnet;
  undefined1 local_698 [128];
  undefined1 local_618 [64];
  undefined1 local_5d8 [160];
  undefined1 local_538 [128];
  undefined1 local_4b8 [64];
  undefined1 local_478 [96];
  undefined1 local_418 [32];
  undefined1 local_3f8 [32];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  undefined1 local_398 [32];
  undefined1 local_378 [32];
  string error;
  char *argv_both [3];
  char *argv_test_no_reg [3];
  char *argv_regtest [2];
  char *argv_testnet4 [2];
  char *argv_testnet [2];
  undefined1 local_2c8 [120];
  TestArgsManager test_args;
  
  local_1000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1000[0]._1_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_ffffffffffffe188);
  local_70c = 1;
  pVar4 = std::make_pair<char_const(&)[9],ArgsManager::Flags>
                    ((char (*) [9])in_stack_ffffffffffffe1a0,(Flags *)in_stack_ffffffffffffe198);
  local_720 = pVar4.first;
  local_718 = pVar4.second;
  local_724 = 1;
  pVar4 = std::make_pair<char_const(&)[10],ArgsManager::Flags>
                    ((char (*) [10])in_stack_ffffffffffffe1a0,(Flags *)in_stack_ffffffffffffe198);
  local_738 = pVar4.first;
  local_730 = pVar4.second;
  local_73c = 1;
  pVar4 = std::make_pair<char_const(&)[9],ArgsManager::Flags>
                    ((char (*) [9])in_stack_ffffffffffffe1a0,(Flags *)in_stack_ffffffffffffe198);
  local_750 = pVar4.first;
  local_748 = pVar4.second;
  regtest.first = local_750;
  regtest.second = local_748;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffffe1b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffffe1b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_ffffffffffffe1b8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffe188);
  __l._M_len = (size_type)in_stack_ffffffffffffe1d8;
  __l._M_array = in_stack_ffffffffffffe1d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe1c8,__l,
           (allocator_type *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0));
  TestArgsManager::SetupArgs
            ((TestArgsManager *)in_stack_ffffffffffffe1d0,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_ffffffffffffe1c8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe198);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffe188);
  local_1920 = (path *)&test_args;
  do {
    local_1920 = local_1920 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffffe188);
  } while (local_1920 != (path *)local_2c8);
  std::__cxx11::string::string(in_stack_ffffffffffffe1a0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a8,local_7c8,local_7e8,0x296,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"main\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1e713b0;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_828,local_838,0x297,1,2,local_378);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_870,local_890,local_8b0,0x299,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_8f0,local_900,0x29a,1,2,local_398);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_938,local_958,local_978,0x29c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"main\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1e713b0;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_9b8,local_9c8,0x29d,1,2,local_3b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a00,local_a20,local_a40,0x29f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"testnet4\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1bb54a5;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_a80,local_a90,0x2a0,1,2,local_3d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ac8,local_ae8,local_b08,0x2a2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"regtest\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1e87834;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_b48,local_b58,0x2a3,1,2,local_3f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b90,local_bb0,local_bd0,0x2a5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_c10,local_c20,0x2a6,1,2,local_418);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c58,local_c78,local_c98,0x2a8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
                 (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe198,
                 SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe190,(char (*) [53])in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe188 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_cf0,local_d10,&local_d20,0x2a9,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffe188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_dc0,local_de0,local_e00,0x2ab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_e01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_e48,local_e58,0x2ad,1,2,local_478);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e90,local_eb0,local_ed0,0x2af,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_ed1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_f18,local_f28,0x2b1,1,2,local_4b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f60,local_f80,local_fa0,0x2b3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_fa1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
                 (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe198,
                 SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe190,(char (*) [53])in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe188 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1000,local_1020,&local_1030,0x2b5,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffe188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10d0,local_10f0,local_1110,0x2b7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_1111);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_1158,local_1168,0x2b9,1,2,local_538);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11a0,local_11c0,local_11e0,699,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_11e1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
                 (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe198,
                 SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe190,(char (*) [53])in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe188 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1240,local_1260,&local_1270,0x2bd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffe188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  ArgsManager::SelectConfigNetwork
            ((ArgsManager *)
             CONCAT17(in_stack_ffffffffffffe1af,
                      CONCAT16(in_stack_ffffffffffffe1ae,in_stack_ffffffffffffe1a8)),
             in_stack_ffffffffffffe1a0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(local_12d9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1318,local_1338,local_1358,0x2c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_1359);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_13a0,local_13b0,0x2c5,1,2,local_5d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13e8,local_1408,local_1428,0x2c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_1429);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_1470,local_1480,0x2c9,1,2,local_618);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,
                        CONCAT16(in_stack_ffffffffffffe25e,in_stack_ffffffffffffe258)),
               (int)((ulong)in_stack_ffffffffffffe250 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14b8,local_14d8,local_14f8,0x2cb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_14f9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
                 (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe198,
                 SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe190,(char (*) [53])in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe188 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1558,local_1578,&local_1588,0x2cd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffe188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    in_stack_ffffffffffffe24f =
         ArgsManager::ParseParameters
                   ((ArgsManager *)
                    CONCAT17(in_stack_ffffffffffffe25f,CONCAT16(uVar3,in_stack_ffffffffffffe258)),
                    (int)((ulong)uVar5 >> 0x20),
                    (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
                    in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    in_stack_ffffffffffffe240 = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1628,local_1648,local_1668,0x2cf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_1669);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe190,(char (*) [1])in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    in_stack_ffffffffffffe198 = "\"test\"";
    in_stack_ffffffffffffe190 = (lazy_ostream *)0x1ccef24;
    in_stack_ffffffffffffe188 = "test_args.GetChainTypeString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_16b0,local_16c0,0x2d1,1,2,local_698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::ParseParameters
              ((ArgsManager *)
               CONCAT17(in_stack_ffffffffffffe25f,CONCAT16(uVar3,in_stack_ffffffffffffe258)),
               (int)((ulong)uVar5 >> 0x20),
               (char **)CONCAT17(in_stack_ffffffffffffe24f,in_stack_ffffffffffffe248),
               in_stack_ffffffffffffe240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe198,
               SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe190,(basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    in_stack_ffffffffffffe188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_16f8,local_1718,local_1738,0x2d3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe1d8,(char *)in_stack_ffffffffffffe1d0,
             (allocator<char> *)in_stack_ffffffffffffe1c8);
  TestArgsManager::ReadConfigString
            ((TestArgsManager *)in_stack_ffffffffffffe1d8,&in_stack_ffffffffffffe1d0->first);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  std::allocator<char>::~allocator(&local_1739);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
               (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
               (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
    ArgsManager::GetChainTypeString_abi_cxx11_(in_stack_ffffffffffffe1b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe188);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe1c8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffe1c7,in_stack_ffffffffffffe1c0),
                 (size_t)in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe198,
                 SUB81((ulong)in_stack_ffffffffffffe190 >> 0x38,0));
      in_stack_ffffffffffffe1c8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe190,(char (*) [53])in_stack_ffffffffffffe188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe198,
                 (pointer)in_stack_ffffffffffffe190,(unsigned_long)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe188 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1798,local_17b8,&local_17c8,0x2d5,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffe188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe188);
      in_stack_ffffffffffffe1c7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffe1c7);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe188);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_ffffffffffffe188);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetChainTypeString)
{
    TestArgsManager test_args;
    const auto testnet = std::make_pair("-testnet", ArgsManager::ALLOW_ANY);
    const auto testnet4 = std::make_pair("-testnet4", ArgsManager::ALLOW_ANY);
    const auto regtest = std::make_pair("-regtest", ArgsManager::ALLOW_ANY);
    test_args.SetupArgs({testnet, testnet4, regtest});

    const char* argv_testnet[] = {"cmd", "-testnet"};
    const char* argv_testnet4[] = {"cmd", "-testnet4"};
    const char* argv_regtest[] = {"cmd", "-regtest"};
    const char* argv_test_no_reg[] = {"cmd", "-testnet", "-noregtest"};
    const char* argv_both[] = {"cmd", "-testnet", "-regtest"};

    // equivalent to "-testnet"
    // regtest in testnet section is ignored
    const char* testnetconf = "testnet=1\nregtest=0\n[test]\nregtest=1";
    std::string error;

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "testnet4");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "regtest");

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    // check setting the network to test (and thus making
    // [test] regtest=1 potentially relevant) doesn't break things
    test_args.SelectConfigNetwork("test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(2, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);
}